

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall
dg::vr::RelationsAnalyzer::canShift
          (RelationsAnalyzer *this,ValueRelations *graph,V param,Type shift)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ValueRelations *this_00;
  reference ppVar4;
  ret_type this_01;
  Type *pTVar5;
  Type in_ECX;
  Value *in_RDX;
  V in_RSI;
  ValueRelations *in_RDI;
  Constant *zero;
  Argument *arg;
  Value *val_1;
  iterator __end3_1;
  iterator __begin3_1;
  VectorSet<const_llvm::Value_*> *__range3_1;
  Function *thisFun;
  Instruction *paramInst;
  ConstantInt *c;
  Type *valType;
  Value **val;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> pair;
  iterator __end2;
  iterator __begin2;
  RelationsMap *__range2;
  Type *paramType;
  undefined4 in_stack_fffffffffffffe98;
  Type in_stack_fffffffffffffe9c;
  ValueRelations *in_stack_fffffffffffffea0;
  pointer lt;
  Handle in_stack_fffffffffffffea8;
  Function *func;
  ValueRelations *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Value **in_stack_fffffffffffffec0;
  V val_00;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_100;
  undefined1 local_f8 [24];
  undefined1 *local_e0;
  Function *local_d8;
  ret_type local_d0;
  ret_type local_c8;
  Type *local_c0;
  reference local_b8;
  Value **local_b0;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_a8;
  VectorSet<const_llvm::Value_*> *local_a0;
  Bucket *local_98;
  _WordT local_90;
  int local_84;
  _Self local_80;
  _Self local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [48];
  undefined1 *local_38;
  Type *local_30;
  Type local_24;
  Value *local_20;
  V local_18;
  byte local_1;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = llvm::Value::getType(in_RDX);
  bVar1 = ValueRelations::hasAnyRelation<llvm::Value_const*>
                    (in_stack_fffffffffffffea0,
                     (Value **)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (bVar1) {
    llvm::Value::getType(local_20);
    bVar1 = llvm::Type::isIntegerTy((Type *)0x1ce5b8);
    if (bVar1) {
      memset(local_70,0,8);
      Relations::Relations((Relations *)0x1ce5f7);
      this_00 = (ValueRelations *)
                Relations::set((Relations *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                               SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
      dg::vr::Relations::getNonStrict(local_24);
      Relations::set((Relations *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
      ValueRelations::getRelated<llvm::Value_const*>
                (this_00,in_stack_fffffffffffffec0,
                 (Relations *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_38 = local_68;
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
           ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
           ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      val_00 = local_18;
      while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                              *)0x1ce6bf);
        local_98 = (ppVar4->first)._M_data;
        local_90 = (ppVar4->second).bits.super__Base_bitset<1UL>._M_w;
        std::reference_wrapper::operator_cast_to_Bucket_
                  ((reference_wrapper<const_dg::vr::Bucket> *)0x1ce6f0);
        local_a0 = ValueRelations::getEqual(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        local_a8._M_current =
             (Value **)
             VectorSet<const_llvm::Value_*>::begin
                       ((VectorSet<const_llvm::Value_*> *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        local_b0 = (Value **)
                   VectorSet<const_llvm::Value_*>::end
                             ((VectorSet<const_llvm::Value_*> *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                   *)in_stack_fffffffffffffea0,
                                  (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
              bVar1) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                     ::operator*(&local_a8);
          local_c0 = llvm::Value::getType(*local_b8);
          bVar1 = llvm::Type::isIntegerTy((Type *)0x1ce787);
          if (bVar1) {
            uVar2 = llvm::Type::getIntegerBitWidth((Type *)0x1ce79d);
            uVar3 = llvm::Type::getIntegerBitWidth((Type *)0x1ce7ae);
            if (uVar2 <= uVar3) {
              bVar1 = Relations::has((Relations *)in_stack_fffffffffffffea0,
                                     in_stack_fffffffffffffe9c);
              if (bVar1) {
                local_1 = 1;
                local_84 = 1;
                goto LAB_001ce896;
              }
              local_c8 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value_const>
                                   ((Value *)in_stack_fffffffffffffea0);
              if (((local_c8 != (ret_type)0x0) &&
                  ((local_24 != SGT ||
                   (bVar1 = llvm::ConstantInt::isMinValue
                                      ((ConstantInt *)in_stack_fffffffffffffea8,
                                       SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0)), !bVar1)))
                  ) && ((local_24 != SLT ||
                        (bVar1 = llvm::ConstantInt::isMaxValue
                                           ((ConstantInt *)in_stack_fffffffffffffea8,
                                            SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0)),
                        !bVar1)))) {
                local_1 = 1;
                local_84 = 1;
                goto LAB_001ce896;
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
          ::operator++(&local_a8);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                      *)in_stack_fffffffffffffea0);
      }
      local_84 = 2;
LAB_001ce896:
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)0x1ce8a3);
      if (local_84 != 1) {
        local_d0 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>
                             ((Value *)in_stack_fffffffffffffea0);
        if (local_d0 != (ret_type)0x0) {
          local_d8 = (Function *)llvm::Instruction::getFunction();
          ValueRelations::getEqual(in_RDI,val_00);
          local_e0 = local_f8;
          local_100._M_current =
               (Value **)
               VectorSet<const_llvm::Value_*>::begin
                         ((VectorSet<const_llvm::Value_*> *)
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          VectorSet<const_llvm::Value_*>::end
                    ((VectorSet<const_llvm::Value_*> *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                     *)in_stack_fffffffffffffea0,
                                    (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                                   ), bVar1) {
            __gnu_cxx::
            __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
            ::operator*(&local_100);
            this_01 = llvm::dyn_cast<llvm::Argument,llvm::Value_const>
                                ((Value *)in_stack_fffffffffffffea0);
            if (this_01 != (ret_type)0x0) {
              llvm::Value::getType((Value *)this_01);
              bVar1 = llvm::Type::isIntegerTy((Type *)0x1ce99b);
              if (bVar1) {
                pTVar5 = llvm::Value::getType((Value *)this_01);
                llvm::ConstantInt::get(pTVar5,0,false);
                bVar1 = ValueRelations::are<llvm::Argument_const*,llvm::Constant_const*>
                                  (in_stack_fffffffffffffeb0,(Argument **)in_stack_fffffffffffffea8,
                                   (Type)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                                   (Constant **)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
                if (bVar1) {
                  lt = (in_RDI->graph).borderBuckets.
                       super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  func = local_d8;
                  dg::vr::Relations::getNonStrict(local_24);
                  StructureAnalyzer::addPrecondition
                            ((StructureAnalyzer *)this_01,func,(Argument *)lt,
                             in_stack_fffffffffffffe9c,(Value *)0x1cea2f);
                }
                else {
                  StructureAnalyzer::addPrecondition
                            ((StructureAnalyzer *)in_stack_fffffffffffffeb0,
                             (Function *)in_stack_fffffffffffffea8,
                             (Argument *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                             (Value *)0x1cea58);
                }
                local_1 = 1;
                local_84 = 1;
                goto LAB_001cea80;
              }
            }
            __gnu_cxx::
            __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
            ::operator++(&local_100);
          }
          local_84 = 6;
LAB_001cea80:
          VectorSet<const_llvm::Value_*>::~VectorSet((VectorSet<const_llvm::Value_*> *)0x1cea8a);
          if (local_84 == 1) goto LAB_001ceaa2;
        }
        local_1 = 0;
      }
      goto LAB_001ceaa2;
    }
  }
  local_1 = 0;
LAB_001ceaa2:
  return (bool)(local_1 & 1);
}

Assistant:

bool RelationsAnalyzer::canShift(const ValueRelations &graph, V param,
                                 Relations::Type shift) {
    const auto *paramType = param->getType();
    assert(Relations::isStrict(shift) && Relations::isSigned(shift));
    if (!graph.hasAnyRelation(param) || !param->getType()->isIntegerTy())
        return false;

    // if there is a value lesser/greater with same or smaller range, then param
    // is also inc/decrementable
    for (auto pair : graph.getRelated(
                 param,
                 Relations().set(shift).set(Relations::getNonStrict(shift)))) {
        for (const auto &val : graph.getEqual(pair.first)) {
            const auto *valType = val->getType();
            if (valType->isIntegerTy() &&
                valType->getIntegerBitWidth() <=
                        paramType->getIntegerBitWidth()) {
                if (pair.second.has(shift))
                    return true;
                assert(pair.second.has(Relations::getNonStrict(shift)));
                if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(val)) {
                    if (!(shift == Relations::SGT && c->isMinValue(true)) &&
                        !(shift == Relations::SLT && c->isMaxValue(true)))
                        return true;
                }
            }
        }
    }

    // if the shifted value is a parameter, it depends on the passed value;
    // check when validating
    if (const auto *paramInst = llvm::dyn_cast<llvm::Instruction>(param)) {
        const llvm::Function *thisFun = paramInst->getFunction();

        for (const auto *val : graph.getEqual(paramInst)) {
            if (const auto *arg = llvm::dyn_cast<llvm::Argument>(val)) {
                if (arg->getType()->isIntegerTy()) {
                    const auto *zero =
                            llvm::ConstantInt::get(arg->getType(), 0);
                    if (graph.are(arg, Relations::NE, zero))
                        structure.addPrecondition(
                                thisFun, arg, Relations::getNonStrict(shift),
                                zero);
                    else
                        structure.addPrecondition(thisFun, arg, shift, zero);
                    return true;
                }
            }
        }
    }
    return false;
}